

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O0

ObjectBase * __thiscall
chatra::Storage::derefDirect<chatra::ObjectBase>(Storage *this,size_t objectIndex)

{
  ObjectBase *pOVar1;
  lock_guard<chatra::SpinLock> lVar2;
  mutex_type *pmVar3;
  IllegalArgumentException *this_00;
  const_reference ppOVar4;
  bool local_b1;
  const_iterator local_b0;
  const_iterator local_80;
  const_iterator local_60;
  _Deque_iterator<unsigned_long,_const_unsigned_long_&,_const_unsigned_long_*> local_40;
  lock_guard<chatra::SpinLock> local_20;
  lock_guard<chatra::SpinLock> lock0;
  size_t objectIndex_local;
  Storage *this_local;
  
  lock0._M_device = (mutex_type *)objectIndex;
  std::lock_guard<chatra::SpinLock>::lock_guard(&local_20,&this->lockObjects);
  lVar2._M_device = lock0._M_device;
  pmVar3 = (mutex_type *)
           std::vector<chatra::Object_*,_std::allocator<chatra::Object_*>_>::size(&this->objects);
  local_b1 = true;
  if (lVar2._M_device < pmVar3) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::cbegin
              (&local_60,&this->recycledObjectIndexes);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::cend
              (&local_80,&this->recycledObjectIndexes);
    std::
    find<std::_Deque_iterator<unsigned_long,unsigned_long_const&,unsigned_long_const*>,unsigned_long>
              (&local_40,&local_60,&local_80,(unsigned_long *)&lock0);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::cend
              (&local_b0,&this->recycledObjectIndexes);
    local_b1 = std::operator!=(&local_40,&local_b0);
  }
  if (local_b1 == false) {
    ppOVar4 = std::vector<chatra::Object_*,_std::allocator<chatra::Object_*>_>::operator[]
                        (&this->objects,(size_type)lock0._M_device);
    pOVar1 = (ObjectBase *)*ppOVar4;
    std::lock_guard<chatra::SpinLock>::~lock_guard(&local_20);
    return pOVar1;
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  (this_00->super_NativeException).message._M_string_length = 0;
  (this_00->super_NativeException).message.field_2._M_allocated_capacity = 0;
  *(undefined8 *)&this_00->super_NativeException = 0;
  *(undefined8 *)&(this_00->super_NativeException).message = 0;
  *(undefined8 *)((long)&(this_00->super_NativeException).message.field_2 + 8) = 0;
  IllegalArgumentException::IllegalArgumentException(this_00);
  __cxa_throw(this_00,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

Type& Storage::derefDirect(size_t objectIndex) const {
	static_assert(std::is_base_of<Object, Type>::value, "Type should be derived class of Object");
	std::lock_guard<SpinLock> lock0(lockObjects);

	if (objectIndex >= objects.size() ||
			std::find(recycledObjectIndexes.cbegin(), recycledObjectIndexes.cend(), objectIndex) != recycledObjectIndexes.cend())
		throw IllegalArgumentException();

	return *static_cast<Type*>(objects[objectIndex]);
}